

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiStreamParser.cpp
# Opt level: O3

Bit32u __thiscall
MT32Emu::MidiStreamParserImpl::parseShortMessageStatus(MidiStreamParserImpl *this,Bit8u *stream)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  
  bVar1 = *stream;
  if ((char)bVar1 < '\0') {
    bVar2 = bVar1;
    bVar3 = bVar1;
    if (0xef < bVar1) {
      if (0xf7 < bVar1) goto LAB_001118a1;
      bVar2 = 0;
    }
    this->runningStatus = bVar2;
  }
  else {
    bVar3 = this->runningStatus;
    if (-1 < (char)this->runningStatus) {
      (**this->midiReporter->_vptr_MidiReporter)
                (this->midiReporter,
                 "processStatusByte: No valid running status yet, MIDI message ignored");
      return 1;
    }
  }
LAB_001118a1:
  *this->streamBuffer = bVar3;
  this->streamBufferSize = this->streamBufferSize + 1;
  return (uint)(bVar1 >> 7);
}

Assistant:

Bit32u MidiStreamParserImpl::parseShortMessageStatus(const Bit8u stream[]) {
	Bit8u status = *stream;
	Bit32u parsedLength = processStatusByte(status) ? 0 : 1;
	if (0x80 <= status) { // If no running status available yet, skip one byte
		*streamBuffer = status;
		++streamBufferSize;
	}
	return parsedLength;
}